

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

GLenum deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::getTargetTextureTarget
                 (LayeredRenderTargetType target)

{
  GLenum GVar1;
  
  GVar1 = 0;
  if (target < TARGET_LAST) {
    GVar1 = *(GLenum *)(&DAT_007f45c0 + (ulong)target * 4);
  }
  return GVar1;
}

Assistant:

glw::GLenum LayeredRenderCase::getTargetTextureTarget (LayeredRenderTargetType target)
{
	switch (target)
	{
		case TARGET_CUBE:			return GL_TEXTURE_CUBE_MAP;
		case TARGET_3D:				return GL_TEXTURE_3D;
		case TARGET_1D_ARRAY:		return GL_TEXTURE_1D_ARRAY;
		case TARGET_2D_ARRAY:		return GL_TEXTURE_2D_ARRAY;
		case TARGET_2D_MS_ARRAY:	return GL_TEXTURE_2D_MULTISAMPLE_ARRAY;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}